

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O1

Error __thiscall
llvm::DWARFUnit::extractRangeList
          (DWARFUnit *this,uint64_t RangeListOffset,DWARFDebugRangeList *RangeList)

{
  DWARFDataExtractor *in_RCX;
  _func_int **pp_Stack_40;
  DWARFDataExtractor RangesData;
  uint64_t ActualRangeListOffset;
  
  if (*(long *)(RangeListOffset + 0x1a8) != *(long *)(RangeListOffset + 0x1b0)) {
    RangesData.super_DataExtractor._16_8_ = *(undefined8 *)(*(long *)(RangeListOffset + 8) + 0x178);
    RangesData.Obj = *(DWARFObject **)(RangeListOffset + 0x70);
    RangesData.super_DataExtractor.Data.Length._0_1_ = *(undefined1 *)(RangeListOffset + 0xbc);
    RangesData.super_DataExtractor.Data.Length._1_1_ = *(undefined1 *)(RangeListOffset + 0x22);
    pp_Stack_40 = (RangesData.Obj)->_vptr_DWARFObject;
    RangesData.super_DataExtractor.Data.Data = ((RangesData.Obj)->Dummy).Data.Data;
    RangesData.Section =
         (DWARFSection *)((long)&RangeList->Offset + *(long *)(RangeListOffset + 0x78));
    DWARFDebugRangeList::extract((DWARFDebugRangeList *)this,in_RCX,(uint64_t *)&pp_Stack_40);
    return (Error)(ErrorInfoBase *)this;
  }
  __assert_fail("!DieArray.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFUnit.cpp"
                ,0x14b,
                "Error llvm::DWARFUnit::extractRangeList(uint64_t, DWARFDebugRangeList &) const");
}

Assistant:

Error DWARFUnit::extractRangeList(uint64_t RangeListOffset,
                                  DWARFDebugRangeList &RangeList) const {
  // Require that compile unit is extracted.
  assert(!DieArray.empty());
  DWARFDataExtractor RangesData(Context.getDWARFObj(), *RangeSection,
                                isLittleEndian, getAddressByteSize());
  uint64_t ActualRangeListOffset = RangeSectionBase + RangeListOffset;
  return RangeList.extract(RangesData, &ActualRangeListOffset);
}